

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildClientReply(Value *__return_storage_ptr__,cmFileAPI *this,ClientQuery *q)

{
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  string *local_48;
  ClientQueryJson *qj;
  Value *local_30;
  Value *reply_query_json;
  ClientQuery *local_20;
  ClientQuery *q_local;
  cmFileAPI *this_local;
  Value *reply;
  
  reply_query_json._7_1_ = 0;
  local_20 = q;
  q_local = (ClientQuery *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  BuildReply(__return_storage_ptr__,this,&q->DirQuery);
  if ((local_20->HaveQueryJson & 1U) != 0) {
    local_30 = Json::Value::operator[](__return_storage_ptr__,"query.json");
    local_48 = &(local_20->QueryJson).Error;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      BuildReplyError(&local_70,local_48);
      Json::Value::operator=(local_30,&local_70);
      Json::Value::~Value(&local_70);
    }
    else {
      bVar1 = Json::Value::isNull((Value *)(local_48 + 1));
      if (!bVar1) {
        Json::Value::Value(&local_98,(Value *)(local_48 + 1));
        pVVar3 = Json::Value::operator[](local_30,"client");
        Json::Value::operator=(pVVar3,&local_98);
        Json::Value::~Value(&local_98);
      }
      bVar1 = Json::Value::isNull((Value *)&local_48[2]._M_string_length);
      if (!bVar1) {
        Json::Value::Value(&local_c0,(Value *)&local_48[2]._M_string_length);
        pVVar3 = Json::Value::operator[](local_30,"requests");
        Json::Value::operator=(pVVar3,&local_c0);
        Json::Value::~Value(&local_c0);
      }
      BuildClientReplyResponses(&local_e8,this,(ClientRequests *)&local_48[3].field_2);
      pVVar3 = Json::Value::operator[](local_30,"responses");
      Json::Value::operator=(pVVar3,&local_e8);
      Json::Value::~Value(&local_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReply(ClientQuery const& q)
{
  Json::Value reply = this->BuildReply(q.DirQuery);

  if (!q.HaveQueryJson) {
    return reply;
  }

  Json::Value& reply_query_json = reply["query.json"];
  ClientQueryJson const& qj = q.QueryJson;

  if (!qj.Error.empty()) {
    reply_query_json = this->BuildReplyError(qj.Error);
    return reply;
  }

  if (!qj.ClientValue.isNull()) {
    reply_query_json["client"] = qj.ClientValue;
  }

  if (!qj.RequestsValue.isNull()) {
    reply_query_json["requests"] = qj.RequestsValue;
  }

  reply_query_json["responses"] = this->BuildClientReplyResponses(qj.Requests);

  return reply;
}